

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::Process(FoldSpecConstantOpAndCompositePass *this)

{
  Op OVar1;
  IRContext *this_00;
  ConstantManager *this_01;
  Module *pMVar2;
  Instruction *pIVar3;
  bool bVar4;
  int iVar5;
  IRContext *pIVar6;
  Type *pTVar7;
  Constant *const_value;
  ulong uVar8;
  iterator inst;
  Status local_3c;
  inst_iterator local_38;
  
  this_00 = (this->super_Pass).context_;
  pIVar6 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
    pIVar6 = (this->super_Pass).context_;
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  pMVar2 = (pIVar6->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  inst.node_ = (pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (inst.node_ ==
      &(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    local_3c = SuccessWithoutChange;
  }
  else {
    local_3c = Failure;
    do {
      pIVar3 = ((inst.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_38.super_iterator.node_ = (iterator)(iterator)inst.node_;
      pTVar7 = analysis::ConstantManager::GetType(this_01,inst.node_);
      if (pTVar7 == (Type *)0x0) {
LAB_005b4ce9:
        OVar1 = (inst.node_)->opcode_;
        uVar8 = (ulong)OVar1;
        if (uVar8 < 0x35) {
          if ((0x85e0000000000U >> (uVar8 & 0x3f) & 1) == 0) {
            if (uVar8 == 0x34) {
              bVar4 = ProcessOpSpecConstantOp(this,&local_38);
              local_3c = (Status)(byte)((byte)local_3c | bVar4);
            }
          }
          else {
            const_value = analysis::ConstantManager::GetConstantFromInst(this_01,inst.node_);
            if (const_value != (Constant *)0x0) {
              if (OVar1 == OpSpecConstantComposite) {
                (inst.node_)->opcode_ = OpConstantComposite;
                local_3c = 1;
              }
              analysis::ConstantManager::MapConstantToInst(this_01,const_value,inst.node_);
            }
          }
        }
      }
      else {
        pTVar7 = analysis::ConstantManager::GetType(this_01,inst.node_);
        iVar5 = (*pTVar7->_vptr_Type[4])(pTVar7);
        if ((char)iVar5 != '\0') goto LAB_005b4ce9;
      }
      inst.node_ = pIVar3;
    } while (pIVar3 != &(((((this->super_Pass).context_)->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
    local_3c = local_3c ^ SuccessWithoutChange;
  }
  return local_3c;
}

Assistant:

Pass::Status FoldSpecConstantOpAndCompositePass::Process() {
  bool modified = false;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  // Traverse through all the constant defining instructions. For Normal
  // Constants whose values are determined and do not depend on OpUndef
  // instructions, records their values in two internal maps: id_to_const_val_
  // and const_val_to_id_ so that we can use them to infer the value of Spec
  // Constants later.
  // For Spec Constants defined with OpSpecConstantComposite instructions, if
  // all of their components are Normal Constants, they will be turned into
  // Normal Constants too. For Spec Constants defined with OpSpecConstantOp
  // instructions, we check if they only depends on Normal Constants and fold
  // them when possible. The two maps for Normal Constants: id_to_const_val_
  // and const_val_to_id_ will be updated along the traversal so that the new
  // Normal Constants generated from folding can be used to fold following Spec
  // Constants.
  // This algorithm depends on the SSA property of SPIR-V when
  // defining constants. The dependent constants must be defined before the
  // dependee constants. So a dependent Spec Constant must be defined and
  // will be processed before its dependee Spec Constant. When we encounter
  // the dependee Spec Constants, all its dependent constants must have been
  // processed and all its dependent Spec Constants should have been folded if
  // possible.
  Module::inst_iterator next_inst = context()->types_values_begin();
  for (Module::inst_iterator inst_iter = next_inst;
       // Need to re-evaluate the end iterator since we may modify the list of
       // instructions in this section of the module as the process goes.
       inst_iter != context()->types_values_end(); inst_iter = next_inst) {
    ++next_inst;
    Instruction* inst = &*inst_iter;
    // Collect constant values of normal constants and process the
    // OpSpecConstantOp and OpSpecConstantComposite instructions if possible.
    // The constant values will be stored in analysis::Constant instances.
    // OpConstantSampler instruction is not collected here because it cannot be
    // used in OpSpecConstant{Composite|Op} instructions.
    // TODO(qining): If the constant or its type has decoration, we may need
    // to skip it.
    if (const_mgr->GetType(inst) &&
        !const_mgr->GetType(inst)->decoration_empty())
      continue;
    switch (spv::Op opcode = inst->opcode()) {
      // Records the values of Normal Constants.
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantComposite:
      case spv::Op::OpSpecConstantComposite: {
        // A Constant instance will be created if the given instruction is a
        // Normal Constant whose value(s) are fixed. Note that for a composite
        // Spec Constant defined with OpSpecConstantComposite instruction, if
        // all of its components are Normal Constants already, the Spec
        // Constant will be turned in to a Normal Constant. In that case, a
        // Constant instance should also be created successfully and recorded
        // in the id_to_const_val_ and const_val_to_id_ mapps.
        if (auto const_value = const_mgr->GetConstantFromInst(inst)) {
          // Need to replace the OpSpecConstantComposite instruction with a
          // corresponding OpConstantComposite instruction.
          if (opcode == spv::Op::OpSpecConstantComposite) {
            inst->SetOpcode(spv::Op::OpConstantComposite);
            modified = true;
          }
          const_mgr->MapConstantToInst(const_value, inst);
        }
        break;
      }
      // For a Spec Constants defined with OpSpecConstantOp instruction, check
      // if it only depends on Normal Constants. If so, the Spec Constant will
      // be folded. The original Spec Constant defining instruction will be
      // replaced by Normal Constant defining instructions, and the new Normal
      // Constants will be added to id_to_const_val_ and const_val_to_id_ so
      // that we can use the new Normal Constants when folding following Spec
      // Constants.
      case spv::Op::OpSpecConstantOp:
        modified |= ProcessOpSpecConstantOp(&inst_iter);
        break;
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}